

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O1

void init_once(void)

{
  int iVar1;
  char *__nptr;
  long lVar2;
  ulong uVar3;
  
  iVar1 = pthread_atfork((__prepare *)0x0,(__parent *)0x0,reset_once);
  if (iVar1 == 0) {
    nthreads = 4;
    __nptr = getenv("UV_THREADPOOL_SIZE");
    if (__nptr != (char *)0x0) {
      nthreads = atoi(__nptr);
    }
    if (nthreads == 0) {
      nthreads = 1;
    }
    if (0x80 < nthreads) {
      nthreads = 0x80;
    }
    threads = default_threads;
    if (4 < (ulong)nthreads) {
      threads = (uv_thread_t *)uv__malloc((ulong)nthreads << 3);
      if (threads == (uv_thread_t *)0x0) {
        nthreads = 4;
        threads = default_threads;
      }
    }
    iVar1 = uv_cond_init(&cond);
    if (iVar1 == 0) {
      iVar1 = uv_mutex_init(&mutex);
      if (iVar1 == 0) {
        wq[0] = wq;
        wq[1] = wq;
        if (nthreads != 0) {
          lVar2 = 0;
          uVar3 = 0;
          do {
            iVar1 = uv_thread_create((uv_thread_t *)((long)threads + lVar2),worker,(void *)0x0);
            if (iVar1 != 0) goto LAB_0054b650;
            uVar3 = uVar3 + 1;
            lVar2 = lVar2 + 8;
          } while (uVar3 < nthreads);
        }
        initialized = 1;
        return;
      }
    }
  }
LAB_0054b650:
  abort();
}

Assistant:

static void init_once(void) {
#ifndef _WIN32
  /* Re-initialize the threadpool after fork.
   * Note that this discards the global mutex and condition as well
   * as the work queue.
   */
  if (pthread_atfork(NULL, NULL, &reset_once))
    abort();
#endif
  init_threads();
}